

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall QGraphicsProxyWidget::~QGraphicsProxyWidget(QGraphicsProxyWidget *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QObject *pQVar4;
  
  *(undefined ***)this = &PTR_metaObject_007ed188;
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsProxyWidget_007ed368;
  *(undefined ***)(this + 0x20) = &PTR__QGraphicsProxyWidget_007ed4a0;
  lVar1 = *(long *)(this + 0x18);
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x208));
  if (bVar3) {
    QObject::removeEventFilter(*(QObject **)(lVar1 + 0x210));
    if ((*(long *)(lVar1 + 0x208) == 0) || (*(int *)(*(long *)(lVar1 + 0x208) + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = *(QObject **)(lVar1 + 0x210);
    }
    QObject::disconnect(pQVar4,"2destroyed()",(QObject *)this,"1_q_removeWidgetSlot()");
    lVar2 = *(long *)(lVar1 + 0x208);
    if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long **)(lVar1 + 0x210) != (long *)0x0))
    {
      (**(code **)(**(long **)(lVar1 + 0x210) + 0x20))();
    }
  }
  QGraphicsWidget::~QGraphicsWidget((QGraphicsWidget *)this);
  return;
}

Assistant:

QGraphicsProxyWidget::~QGraphicsProxyWidget()
{
    Q_D(QGraphicsProxyWidget);
    if (d->widget) {
        d->widget->removeEventFilter(this);
        QObject::disconnect(d->widget, SIGNAL(destroyed()), this, SLOT(_q_removeWidgetSlot()));
        delete d->widget;
    }
}